

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BranchAndBound.cpp
# Opt level: O3

size_t __thiscall
tsbp::TwoStepBranchingProcedure::InitializeSearchTree(TwoStepBranchingProcedure *this)

{
  int iVar1;
  iterator __position;
  pointer pdVar2;
  pointer __s;
  pointer puVar3;
  unsigned_long uVar4;
  tuple<tsbp::PackingRelaxed2D_*,_std::default_delete<tsbp::PackingRelaxed2D>_> this_00;
  pointer __p;
  pointer psVar5;
  unique_ptr<tsbp::PackingRelaxed2D,_std::default_delete<tsbp::PackingRelaxed2D>_> layout2D;
  size_t rootNodeId;
  __uniq_ptr_impl<tsbp::PackingRelaxed2D,_std::default_delete<tsbp::PackingRelaxed2D>_> local_30;
  unsigned_long local_28;
  
  std::
  vector<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_tsbp::TwoStepBranchingProcedure::Node,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_tsbp::TwoStepBranchingProcedure::Node,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_tsbp::TwoStepBranchingProcedure::Node,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_tsbp::TwoStepBranchingProcedure::Node,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex>_>
  ::resize(&(this->tree).super_type.m_vertices,
           ((long)(this->tree).super_type.m_vertices.
                  super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_tsbp::TwoStepBranchingProcedure::Node,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_tsbp::TwoStepBranchingProcedure::Node,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_tsbp::TwoStepBranchingProcedure::Node,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_tsbp::TwoStepBranchingProcedure::Node,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)(this->tree).super_type.m_vertices.
                  super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_tsbp::TwoStepBranchingProcedure::Node,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_tsbp::TwoStepBranchingProcedure::Node,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_tsbp::TwoStepBranchingProcedure::Node,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_tsbp::TwoStepBranchingProcedure::Node,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex>_>
                  ._M_impl.super__Vector_impl_data._M_start >> 4) * -0x5555555555555555 + 1);
  psVar5 = (this->tree).super_type.m_vertices.
           super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_tsbp::TwoStepBranchingProcedure::Node,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_tsbp::TwoStepBranchingProcedure::Node,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_tsbp::TwoStepBranchingProcedure::Node,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_tsbp::TwoStepBranchingProcedure::Node,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_28 = ((long)(this->tree).super_type.m_vertices.
                    super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_tsbp::TwoStepBranchingProcedure::Node,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_tsbp::TwoStepBranchingProcedure::Node,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_tsbp::TwoStepBranchingProcedure::Node,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_tsbp::TwoStepBranchingProcedure::Node,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex>_>
                    ._M_impl.super__Vector_impl_data._M_finish - (long)psVar5 >> 4) *
             -0x5555555555555555 - 1;
  __position._M_current =
       (this->activeNodes).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
       .super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->activeNodes).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_long,std::allocator<unsigned_long>>::
    _M_realloc_insert<unsigned_long_const&>
              ((vector<unsigned_long,std::allocator<unsigned_long>> *)&this->activeNodes,__position,
               &local_28);
    psVar5 = (this->tree).super_type.m_vertices.
             super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_tsbp::TwoStepBranchingProcedure::Node,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_tsbp::TwoStepBranchingProcedure::Node,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_tsbp::TwoStepBranchingProcedure::Node,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_tsbp::TwoStepBranchingProcedure::Node,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex>_>
             ._M_impl.super__Vector_impl_data._M_start;
  }
  else {
    *__position._M_current = local_28;
    (this->activeNodes).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish = __position._M_current + 1;
  }
  uVar4 = local_28;
  psVar5[local_28].super_StoredVertex.m_property.super_BaseNode.ItemIdToPlace = -1;
  *(Status *)((long)&psVar5[local_28].super_StoredVertex.m_property.super_BaseNode + 8) = Root;
  this_00.
  super__Tuple_impl<0UL,_tsbp::PackingRelaxed2D_*,_std::default_delete<tsbp::PackingRelaxed2D>_>.
  super__Head_base<0UL,_tsbp::PackingRelaxed2D_*,_false>._M_head_impl =
       (_Tuple_impl<0UL,_tsbp::PackingRelaxed2D_*,_std::default_delete<tsbp::PackingRelaxed2D>_>)
       operator_new(0xa0);
  memset((void *)this_00.
                 super__Tuple_impl<0UL,_tsbp::PackingRelaxed2D_*,_std::default_delete<tsbp::PackingRelaxed2D>_>
                 .super__Head_base<0UL,_tsbp::PackingRelaxed2D_*,_false>._M_head_impl,0,0xa0);
  *(undefined8 *)
   ((long)this_00.
          super__Tuple_impl<0UL,_tsbp::PackingRelaxed2D_*,_std::default_delete<tsbp::PackingRelaxed2D>_>
          .super__Head_base<0UL,_tsbp::PackingRelaxed2D_*,_false>._M_head_impl + 8) =
       0x7fffffff7fffffff;
  (((dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)
   ((long)this_00.
          super__Tuple_impl<0UL,_tsbp::PackingRelaxed2D_*,_std::default_delete<tsbp::PackingRelaxed2D>_>
          .super__Head_base<0UL,_tsbp::PackingRelaxed2D_*,_false>._M_head_impl + 0x18))->m_bits).
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  *(pointer *)
   ((long)this_00.
          super__Tuple_impl<0UL,_tsbp::PackingRelaxed2D_*,_std::default_delete<tsbp::PackingRelaxed2D>_>
          .super__Head_base<0UL,_tsbp::PackingRelaxed2D_*,_false>._M_head_impl + 0x20) =
       (pointer)0x0;
  *(pointer *)
   ((long)this_00.
          super__Tuple_impl<0UL,_tsbp::PackingRelaxed2D_*,_std::default_delete<tsbp::PackingRelaxed2D>_>
          .super__Head_base<0UL,_tsbp::PackingRelaxed2D_*,_false>._M_head_impl + 0x28) =
       (pointer)0x0;
  *(size_type *)
   ((long)this_00.
          super__Tuple_impl<0UL,_tsbp::PackingRelaxed2D_*,_std::default_delete<tsbp::PackingRelaxed2D>_>
          .super__Head_base<0UL,_tsbp::PackingRelaxed2D_*,_false>._M_head_impl + 0x30) = 0;
  (((dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)
   ((long)this_00.
          super__Tuple_impl<0UL,_tsbp::PackingRelaxed2D_*,_std::default_delete<tsbp::PackingRelaxed2D>_>
          .super__Head_base<0UL,_tsbp::PackingRelaxed2D_*,_false>._M_head_impl + 0x38))->m_bits).
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  *(pointer *)
   ((long)this_00.
          super__Tuple_impl<0UL,_tsbp::PackingRelaxed2D_*,_std::default_delete<tsbp::PackingRelaxed2D>_>
          .super__Head_base<0UL,_tsbp::PackingRelaxed2D_*,_false>._M_head_impl + 0x40) =
       (pointer)0x0;
  *(pointer *)
   ((long)this_00.
          super__Tuple_impl<0UL,_tsbp::PackingRelaxed2D_*,_std::default_delete<tsbp::PackingRelaxed2D>_>
          .super__Head_base<0UL,_tsbp::PackingRelaxed2D_*,_false>._M_head_impl + 0x48) =
       (pointer)0x0;
  *(size_type *)
   ((long)this_00.
          super__Tuple_impl<0UL,_tsbp::PackingRelaxed2D_*,_std::default_delete<tsbp::PackingRelaxed2D>_>
          .super__Head_base<0UL,_tsbp::PackingRelaxed2D_*,_false>._M_head_impl + 0x50) = 0;
  (((vector<int,_std::allocator<int>_> *)
   ((long)this_00.
          super__Tuple_impl<0UL,_tsbp::PackingRelaxed2D_*,_std::default_delete<tsbp::PackingRelaxed2D>_>
          .super__Head_base<0UL,_tsbp::PackingRelaxed2D_*,_false>._M_head_impl + 0x58))->
  super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  *(pointer *)
   ((long)this_00.
          super__Tuple_impl<0UL,_tsbp::PackingRelaxed2D_*,_std::default_delete<tsbp::PackingRelaxed2D>_>
          .super__Head_base<0UL,_tsbp::PackingRelaxed2D_*,_false>._M_head_impl + 0x60) =
       (pointer)0x0;
  *(pointer *)
   ((long)this_00.
          super__Tuple_impl<0UL,_tsbp::PackingRelaxed2D_*,_std::default_delete<tsbp::PackingRelaxed2D>_>
          .super__Head_base<0UL,_tsbp::PackingRelaxed2D_*,_false>._M_head_impl + 0x68) =
       (pointer)0x0;
  (((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
   ((long)this_00.
          super__Tuple_impl<0UL,_tsbp::PackingRelaxed2D_*,_std::default_delete<tsbp::PackingRelaxed2D>_>
          .super__Head_base<0UL,_tsbp::PackingRelaxed2D_*,_false>._M_head_impl + 0x70))->
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.super__Vector_impl_data
  ._M_start = (pointer)0x0;
  *(pointer *)
   ((long)this_00.
          super__Tuple_impl<0UL,_tsbp::PackingRelaxed2D_*,_std::default_delete<tsbp::PackingRelaxed2D>_>
          .super__Head_base<0UL,_tsbp::PackingRelaxed2D_*,_false>._M_head_impl + 0x78) =
       (pointer)0x0;
  *(pointer *)
   ((long)this_00.
          super__Tuple_impl<0UL,_tsbp::PackingRelaxed2D_*,_std::default_delete<tsbp::PackingRelaxed2D>_>
          .super__Head_base<0UL,_tsbp::PackingRelaxed2D_*,_false>._M_head_impl + 0x80) =
       (pointer)0x0;
  *(double *)
   ((long)this_00.
          super__Tuple_impl<0UL,_tsbp::PackingRelaxed2D_*,_std::default_delete<tsbp::PackingRelaxed2D>_>
          .super__Head_base<0UL,_tsbp::PackingRelaxed2D_*,_false>._M_head_impl + 0x88) = 0.0;
  local_30._M_t.
  super__Tuple_impl<0UL,_tsbp::PackingRelaxed2D_*,_std::default_delete<tsbp::PackingRelaxed2D>_>.
  super__Head_base<0UL,_tsbp::PackingRelaxed2D_*,_false>._M_head_impl =
       (tuple<tsbp::PackingRelaxed2D_*,_std::default_delete<tsbp::PackingRelaxed2D>_>)
       (tuple<tsbp::PackingRelaxed2D_*,_std::default_delete<tsbp::PackingRelaxed2D>_>)
       this_00.
       super__Tuple_impl<0UL,_tsbp::PackingRelaxed2D_*,_std::default_delete<tsbp::PackingRelaxed2D>_>
       .super__Head_base<0UL,_tsbp::PackingRelaxed2D_*,_false>._M_head_impl;
  PackingRelaxed2D::Initialize
            ((PackingRelaxed2D *)
             this_00.
             super__Tuple_impl<0UL,_tsbp::PackingRelaxed2D_*,_std::default_delete<tsbp::PackingRelaxed2D>_>
             .super__Head_base<0UL,_tsbp::PackingRelaxed2D_*,_false>._M_head_impl,&this->items,
             &this->container);
  local_30._M_t.
  super__Tuple_impl<0UL,_tsbp::PackingRelaxed2D_*,_std::default_delete<tsbp::PackingRelaxed2D>_>.
  super__Head_base<0UL,_tsbp::PackingRelaxed2D_*,_false>._M_head_impl =
       (tuple<tsbp::PackingRelaxed2D_*,_std::default_delete<tsbp::PackingRelaxed2D>_>)
       (_Tuple_impl<0UL,_tsbp::PackingRelaxed2D_*,_std::default_delete<tsbp::PackingRelaxed2D>_>)0x0
  ;
  std::__uniq_ptr_impl<tsbp::PackingRelaxed2D,_std::default_delete<tsbp::PackingRelaxed2D>_>::reset
            ((__uniq_ptr_impl<tsbp::PackingRelaxed2D,_std::default_delete<tsbp::PackingRelaxed2D>_>
              *)&psVar5[uVar4].super_StoredVertex.m_property.Packing,
             (pointer)this_00.
                      super__Tuple_impl<0UL,_tsbp::PackingRelaxed2D_*,_std::default_delete<tsbp::PackingRelaxed2D>_>
                      .super__Head_base<0UL,_tsbp::PackingRelaxed2D_*,_false>._M_head_impl);
  if ((this->fixedItemAtOrigin).super__Optional_base<int,_true,_true>._M_payload.
      super__Optional_payload_base<int>._M_engaged == true) {
    iVar1 = (this->fixedItemAtOrigin).super__Optional_base<int,_true,_true>._M_payload.
            super__Optional_payload_base<int>._M_payload._M_value;
    pdVar2 = (this->itemSpecificPlacementPointsX).
             super__Vector_base<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    __s = *(pointer *)
           &pdVar2[iVar1].m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
            _M_impl;
    puVar3 = *(pointer *)
              ((long)&pdVar2[iVar1].m_bits.
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl + 8)
    ;
    if (__s != puVar3) {
      memset(__s,0,(long)puVar3 - (long)__s & 0xfffffffffffffff8);
    }
    if (pdVar2[iVar1].m_num_bits == 0) {
      __assert_fail("pos < m_num_bits","/usr/include/boost/dynamic_bitset/dynamic_bitset.hpp",0x40b,
                    "dynamic_bitset<Block, Allocator> &boost::dynamic_bitset<>::set(size_type, bool) [Block = unsigned long, Allocator = std::allocator<unsigned long>]"
                   );
    }
    *(byte *)__s = (byte)*__s | 1;
  }
  uVar4 = local_28;
  std::unique_ptr<tsbp::PackingRelaxed2D,_std::default_delete<tsbp::PackingRelaxed2D>_>::~unique_ptr
            ((unique_ptr<tsbp::PackingRelaxed2D,_std::default_delete<tsbp::PackingRelaxed2D>_> *)
             &local_30);
  return uVar4;
}

Assistant:

size_t TwoStepBranchingProcedure::InitializeSearchTree()
{
    size_t rootNodeId = boost::add_vertex(this->tree);
    this->activeNodes.push_back(rootNodeId);

    Node& rootNode = this->tree[rootNodeId];
    rootNode.ItemIdToPlace = -1;
    rootNode.NodeStatus = BaseNode::Status::Root;

    std::unique_ptr<PackingRelaxed2D> layout2D = std::make_unique<PackingRelaxed2D>();
    layout2D->Initialize(items, container);

    rootNode.Packing = std::move(layout2D);

    if (this->fixedItemAtOrigin.has_value())
    {
        // Restrict placement of fixedItem
        this->itemSpecificPlacementPointsX[this->fixedItemAtOrigin.value()].reset();
        this->itemSpecificPlacementPointsX[this->fixedItemAtOrigin.value()].set(0);

        ////this->tree.m_vertices.reserve(250000000);
    }

    return rootNodeId;
}